

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ThreadedSectionInfo::~ThreadedSectionInfo(ThreadedSectionInfo *this)

{
  pointer pcVar1;
  
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ThreadedSectionInfo_00164f28;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::~vector(&this->children);
  IReporter::~IReporter((IReporter *)this);
  pcVar1 = (this->super_SectionInfo).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SectionInfo).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_SectionInfo).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SectionInfo).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_SectionInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SectionInfo).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ThreadedSectionInfo::~ThreadedSectionInfo() {}